

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::SolverState::Clear(SolverState *this)

{
  uint uVar1;
  LogMessage *other;
  string *psVar2;
  LogFinisher local_49;
  LogMessage local_48;
  
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<caffe::BlobProto>::TypeHandler>
            (&(this->history_).super_RepeatedPtrFieldBase);
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar2 = (this->learned_net_).ptr_;
    if (psVar2 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_48,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                 ,0x27c9);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_48,
                         "CHECK failed: !learned_net_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                        );
      google::protobuf::internal::LogFinisher::operator=(&local_49,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_48);
      psVar2 = (this->learned_net_).ptr_;
    }
    psVar2->_M_string_length = 0;
    *(psVar2->_M_dataplus)._M_p = '\0';
    uVar1 = (this->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 6) != 0) {
    this->iter_ = 0;
    this->current_step_ = 0;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void SolverState::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.SolverState)
  history_.Clear();
  if (has_learned_net()) {
    GOOGLE_DCHECK(!learned_net_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
    (*learned_net_.UnsafeRawStringPointer())->clear();
  }
  if (_has_bits_[0 / 32] & 6u) {
    ::memset(&iter_, 0, reinterpret_cast<char*>(&current_step_) -
      reinterpret_cast<char*>(&iter_) + sizeof(current_step_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}